

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::SIMDExtract::finalize(SIMDExtract *this)

{
  bool bVar1;
  Type local_40;
  BasicType local_34;
  Type local_30;
  Type local_28;
  Type local_20;
  Type local_18;
  SIMDExtract *local_10;
  SIMDExtract *this_local;
  
  local_10 = this;
  if (this->vec != (Expression *)0x0) {
    switch(this->op) {
    case ExtractLaneSVecI8x16:
    case ExtractLaneUVecI8x16:
    case ExtractLaneSVecI16x8:
    case ExtractLaneUVecI16x8:
    case ExtractLaneVecI32x4:
      wasm::Type::Type(&local_18,i32);
      (this->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id =
           local_18.id;
      break;
    case ExtractLaneVecI64x2:
      wasm::Type::Type(&local_20,i64);
      (this->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id =
           local_20.id;
      break;
    case ExtractLaneVecF16x8:
    case ExtractLaneVecF32x4:
      wasm::Type::Type(&local_28,f32);
      (this->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id =
           local_28.id;
      break;
    case ExtractLaneVecF64x2:
      wasm::Type::Type(&local_30,f64);
      (this->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id =
           local_30.id;
      break;
    default:
      handle_unreachable("unexpected op",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm.cpp"
                         ,0x18a);
    }
    local_34 = unreachable;
    bVar1 = wasm::Type::operator==(&this->vec->type,&local_34);
    if (bVar1) {
      wasm::Type::Type(&local_40,unreachable);
      (this->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id =
           local_40.id;
    }
    return;
  }
  __assert_fail("vec",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm.cpp"
                ,0x176,"void wasm::SIMDExtract::finalize()");
}

Assistant:

void SIMDExtract::finalize() {
  assert(vec);
  switch (op) {
    case ExtractLaneSVecI8x16:
    case ExtractLaneUVecI8x16:
    case ExtractLaneSVecI16x8:
    case ExtractLaneUVecI16x8:
    case ExtractLaneVecI32x4:
      type = Type::i32;
      break;
    case ExtractLaneVecI64x2:
      type = Type::i64;
      break;
    case ExtractLaneVecF16x8:
    case ExtractLaneVecF32x4:
      type = Type::f32;
      break;
    case ExtractLaneVecF64x2:
      type = Type::f64;
      break;
    default:
      WASM_UNREACHABLE("unexpected op");
  }
  if (vec->type == Type::unreachable) {
    type = Type::unreachable;
  }
}